

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O3

Box<Dims> *
adios2::helper::IntersectionStartCount
          (Box<Dims> *__return_storage_ptr__,Dims *start1,Dims *count1,Dims *start2,Dims *count2)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  iterator iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_type __n;
  size_t intersectionStart;
  ulong local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  long local_48;
  Dims *local_40;
  unsigned_long local_38;
  
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (start1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (start1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar2 - (long)puVar1 >> 3;
  if (puVar2 != puVar1) {
    lVar10 = 0;
    do {
      uVar8 = (start2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      if ((puVar1[lVar10] +
          (count1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar10]) - 1 < uVar8) {
        return __return_storage_ptr__;
      }
      if ((uVar8 + (count2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar10]) - 1 < puVar1[lVar10]) {
        return __return_storage_ptr__;
      }
      lVar10 = lVar10 + 1;
    } while (__n + (__n == 0) != lVar10);
  }
  local_40 = start1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&__return_storage_ptr__->first,__n);
  local_50 = &__return_storage_ptr__->second;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_50,__n);
  if (puVar2 != puVar1) {
    local_48 = __n + (__n == 0);
    lVar10 = 0;
    do {
      puVar1 = (local_40->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar8 = puVar1[lVar10];
      puVar2 = (start2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_58 = puVar2[lVar10];
      if (local_58 < uVar8) {
        local_58 = uVar8;
      }
      uVar3 = puVar1[lVar10];
      uVar4 = (count1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      uVar5 = puVar2[lVar10];
      uVar6 = (count2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      iVar7._M_current =
           (__return_storage_ptr__->first).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (__return_storage_ptr__->first).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                   iVar7,&local_58);
      }
      else {
        *iVar7._M_current = local_58;
        (__return_storage_ptr__->first).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      uVar8 = (uVar6 - 1) + uVar5;
      uVar9 = (uVar3 + uVar4) - 1;
      if (uVar9 < uVar8) {
        uVar8 = uVar9;
      }
      local_38 = (uVar8 - local_58) + 1;
      iVar7._M_current =
           (__return_storage_ptr__->second).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (__return_storage_ptr__->second).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (local_50,iVar7,&local_38);
      }
      else {
        *iVar7._M_current = local_38;
        (__return_storage_ptr__->second).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      lVar10 = lVar10 + 1;
    } while (local_48 != lVar10);
  }
  return __return_storage_ptr__;
}

Assistant:

Box<Dims> IntersectionStartCount(const Dims &start1, const Dims &count1, const Dims &start2,
                                 const Dims &count2) noexcept
{
    Box<Dims> intersectionStartCount;
    const size_t dimensionsSize = start1.size();

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // Don't intercept
        const size_t end1 = start1[d] + count1[d] - 1;
        const size_t end2 = start2[d] + count2[d] - 1;

        if (start2[d] > end1 || end2 < start1[d])
        {
            return intersectionStartCount;
        }
    }

    intersectionStartCount.first.reserve(dimensionsSize);
    intersectionStartCount.second.reserve(dimensionsSize);

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        const size_t intersectionStart = (start1[d] < start2[d]) ? start2[d] : start1[d];

        // end, must be inclusive
        const size_t end1 = start1[d] + count1[d] - 1;
        const size_t end2 = start2[d] + count2[d] - 1;
        const size_t intersectionEnd = (end1 > end2) ? end2 : end1;

        intersectionStartCount.first.push_back(intersectionStart);
        intersectionStartCount.second.push_back(intersectionEnd - intersectionStart + 1);
    }

    return intersectionStartCount;
}